

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O1

void __thiscall LengauerTarjan::~LengauerTarjan(LengauerTarjan *this)

{
  ~LengauerTarjan(this);
  operator_delete(this);
  return;
}

Assistant:

void LengauerTarjan::run(int /*root*/) {
	init();
	DFS();

	/*for (int i = 0; i <= count; i++) {
		cout << "("<<i<<","<<semi[i] <<") ";
		}
		cout <<endl;
	*/
	find_doms();
	/*
		for (int i = 0; i <= count; i++) {
		cout << "("<<i<<","<<idom[i] <<") ";
		}
		cout <<endl;
	*/
}